

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O0

Load * wasm::getSingleLoad(LocalGraph *localGraph,LocalGet *get,PassOptions *passOptions,
                          Module *module)

{
  size_t sVar1;
  value_type *ppLVar2;
  pair<std::_Rb_tree_const_iterator<wasm::LocalGet_*>,_bool> pVar3;
  Load *load;
  PassOptions *local_c8;
  LocalGet *parentGet;
  Expression *value;
  value_type local_98;
  LocalSet *set;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *local_88;
  mapped_type *sets;
  undefined1 local_78;
  undefined1 local_60 [8];
  set<wasm::LocalGet_*,_std::less<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_> seen;
  Module *module_local;
  PassOptions *passOptions_local;
  LocalGet *get_local;
  LocalGraph *localGraph_local;
  
  seen._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)module;
  passOptions_local = (PassOptions *)get;
  get_local = (LocalGet *)localGraph;
  std::set<wasm::LocalGet_*,_std::less<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>::set
            ((set<wasm::LocalGet_*,_std::less<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
              *)local_60);
  pVar3 = std::set<wasm::LocalGet_*,_std::less<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
          ::insert((set<wasm::LocalGet_*,_std::less<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                    *)local_60,(value_type *)&passOptions_local);
  sets = (mapped_type *)pVar3.first._M_node;
  local_78 = pVar3.second;
  do {
    local_88 = &std::
                unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                ::operator[]((unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                              *)get_local,(key_type *)&passOptions_local)->
                super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
    ;
    sVar1 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
            ::size(local_88);
    if (sVar1 != 1) {
      localGraph_local = (LocalGraph *)0x0;
LAB_0157f462:
      set._4_4_ = 1;
      std::set<wasm::LocalGet_*,_std::less<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>::
      ~set((set<wasm::LocalGet_*,_std::less<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_> *)
           local_60);
      return (Load *)localGraph_local;
    }
    SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
    ::begin((Iterator *)&value,local_88);
    ppLVar2 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
              ::
              IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
              ::operator*((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                           *)&value);
    local_98 = *ppLVar2;
    if (local_98 == (value_type)0x0) {
      localGraph_local = (LocalGraph *)0x0;
      goto LAB_0157f462;
    }
    parentGet = (LocalGet *)
                Properties::getFallthrough
                          (local_98->value,passOptions,
                           (Module *)seen._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           AllowTeeBrIf);
    local_c8 = (PassOptions *)Expression::dynCast<wasm::LocalGet>((Expression *)parentGet);
    if (local_c8 == (PassOptions *)0x0) {
      localGraph_local = (LocalGraph *)Expression::dynCast<wasm::Load>((Expression *)parentGet);
      if (localGraph_local == (LocalGraph *)0x0) {
        localGraph_local = (LocalGraph *)0x0;
      }
      goto LAB_0157f462;
    }
    pVar3 = std::set<wasm::LocalGet*,std::less<wasm::LocalGet*>,std::allocator<wasm::LocalGet*>>::
            emplace<wasm::LocalGet*&>
                      ((set<wasm::LocalGet*,std::less<wasm::LocalGet*>,std::allocator<wasm::LocalGet*>>
                        *)local_60,(LocalGet **)&local_c8);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      localGraph_local = (LocalGraph *)0x0;
      goto LAB_0157f462;
    }
    passOptions_local = local_c8;
  } while( true );
}

Assistant:

static Load* getSingleLoad(LocalGraph* localGraph,
                           LocalGet* get,
                           const PassOptions& passOptions,
                           Module& module) {
  std::set<LocalGet*> seen;
  seen.insert(get);
  while (1) {
    auto& sets = localGraph->getSetses[get];
    if (sets.size() != 1) {
      return nullptr;
    }
    auto* set = *sets.begin();
    if (!set) {
      return nullptr;
    }
    auto* value = Properties::getFallthrough(set->value, passOptions, module);
    if (auto* parentGet = value->dynCast<LocalGet>()) {
      if (seen.emplace(parentGet).second) {
        get = parentGet;
        continue;
      }
      // We are in a cycle of gets, in unreachable code.
      return nullptr;
    }
    if (auto* load = value->dynCast<Load>()) {
      return load;
    }
    return nullptr;
  }
}